

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hardwarex.cpp
# Opt level: O3

int StartScanThreadRPLIDARx(RPLIDAR *pRPLIDAR)

{
  int iVar1;
  int iVar2;
  long lVar3;
  THREAD_IDENTIFIER *pThreadId;
  CRITICAL_SECTION *__mutex;
  pthread_mutexattr_t attr;
  pthread_mutexattr_t local_2c;
  
  __mutex = RPLIDARCS;
  pThreadId = RPLIDARScanThreadId;
  lVar3 = 0;
  do {
    if (*(RPLIDAR **)((long)addrsRPLIDAR + lVar3 * 2) == pRPLIDAR) {
      *(undefined4 *)((long)resRPLIDAR + lVar3) = 1;
      *(undefined4 *)((long)bExitScanRPLIDAR + lVar3) = 0;
      iVar1 = pthread_mutexattr_init(&local_2c);
      if (iVar1 == 0) {
        iVar1 = pthread_mutexattr_settype(&local_2c,1);
        if (iVar1 == 0) {
          iVar1 = pthread_mutex_init((pthread_mutex_t *)__mutex,&local_2c);
          iVar2 = pthread_mutexattr_destroy(&local_2c);
          if ((iVar1 == 0) && (iVar2 != 0)) {
            pthread_mutex_destroy((pthread_mutex_t *)__mutex);
          }
        }
        else {
          pthread_mutexattr_destroy(&local_2c);
        }
      }
      iVar1 = CreateDefaultThread(RPLIDARScanThread,pRPLIDAR,pThreadId);
      return iVar1;
    }
    lVar3 = lVar3 + 4;
    __mutex = __mutex + 1;
    pThreadId = pThreadId + 1;
  } while (lVar3 != 0x40);
  return 1;
}

Assistant:

HARDWAREX_API int StartScanThreadRPLIDARx(RPLIDAR* pRPLIDAR)
{
	int id = 0;

	while (addrsRPLIDAR[id] != pRPLIDAR)
	{
		id++;
		if (id >= MAX_NB_DEVICES_HARDWAREX) return EXIT_FAILURE;
	}

	resRPLIDAR[id] = EXIT_FAILURE;
	bExitScanRPLIDAR[id] = FALSE;
	InitCriticalSection(&RPLIDARCS[id]);
	return CreateDefaultThread(RPLIDARScanThread, (void*)pRPLIDAR, &RPLIDARScanThreadId[id]);
}